

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int yaml_parser_parse_flow_mapping_key(yaml_parser_t *parser,yaml_event_t *event,int first)

{
  yaml_mark_t **ppyVar1;
  yaml_parser_state_t **ppyVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  yaml_mark_t *pyVar10;
  yaml_token_t *pyVar11;
  yaml_char_t *pyVar12;
  yaml_parser_state_t *pyVar13;
  yaml_token_type_t yVar14;
  int iVar15;
  
  if (first == 0) {
    if (parser->token_available == 0) goto LAB_001ada71;
  }
  else {
    if ((parser->token_available == 0) &&
       (iVar9 = yaml_parser_fetch_more_tokens(parser), iVar9 == 0)) {
      pyVar11 = (yaml_token_t *)0x0;
    }
    else {
      pyVar11 = (parser->tokens).head;
    }
    pyVar10 = (parser->marks).top;
    if (pyVar10 == (parser->marks).end) {
      ppyVar1 = &(parser->marks).top;
      iVar9 = yaml_stack_extend(&(parser->marks).start,ppyVar1,&(parser->marks).end);
      if (iVar9 == 0) goto LAB_001add0f;
      pyVar10 = *ppyVar1;
    }
    (parser->marks).top = pyVar10 + 1;
    pyVar10->column = (pyVar11->start_mark).column;
    sVar3 = (pyVar11->start_mark).line;
    pyVar10->index = (pyVar11->start_mark).index;
    pyVar10->line = sVar3;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    pyVar11 = (parser->tokens).head;
    parser->stream_end_produced = (uint)(pyVar11->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = pyVar11 + 1;
LAB_001ada71:
    iVar9 = yaml_parser_fetch_more_tokens(parser);
    if (iVar9 == 0) {
      return 0;
    }
  }
  pyVar11 = (parser->tokens).head;
  if (pyVar11 == (yaml_token_t *)0x0) {
    return 0;
  }
  yVar14 = pyVar11->type;
  if (yVar14 != YAML_FLOW_MAPPING_END_TOKEN) {
    if (first == 0) {
      if (yVar14 != YAML_FLOW_ENTRY_TOKEN) {
        pyVar10 = (parser->marks).top;
        (parser->marks).top = pyVar10 + -1;
        sVar3 = (pyVar11->start_mark).column;
        sVar5 = (pyVar11->start_mark).index;
        sVar6 = (pyVar11->start_mark).line;
        sVar7 = pyVar10[-1].index;
        sVar8 = pyVar10[-1].line;
        sVar4 = pyVar10[-1].column;
        parser->error = YAML_PARSER_ERROR;
        parser->context = "while parsing a flow mapping";
        (parser->context_mark).index = sVar7;
        (parser->context_mark).line = sVar8;
        (parser->context_mark).column = sVar4;
        parser->problem = "did not find expected \',\' or \'}\'";
        (parser->problem_mark).index = sVar5;
        (parser->problem_mark).line = sVar6;
        (parser->problem_mark).column = sVar3;
        return 0;
      }
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      parser->stream_end_produced = 0;
      (parser->tokens).head = pyVar11 + 1;
      iVar9 = yaml_parser_fetch_more_tokens(parser);
      if (iVar9 == 0) {
        return 0;
      }
      pyVar11 = (parser->tokens).head;
      if (pyVar11 == (yaml_token_t *)0x0) {
        return 0;
      }
      yVar14 = pyVar11->type;
    }
    if (yVar14 != YAML_FLOW_MAPPING_END_TOKEN) {
      if (yVar14 == YAML_KEY_TOKEN) {
        iVar15 = 0;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = 0;
        (parser->tokens).head = pyVar11 + 1;
        iVar9 = yaml_parser_fetch_more_tokens(parser);
        if (iVar9 == 0) {
          return 0;
        }
        pyVar11 = (parser->tokens).head;
        if (pyVar11 == (yaml_token_t *)0x0) {
          return 0;
        }
        if ((pyVar11->type < YAML_ALIAS_TOKEN) &&
           ((0x2a000U >> (pyVar11->type & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) != 0)) {
          parser->state = YAML_PARSE_FLOW_MAPPING_VALUE_STATE;
          sVar3 = (pyVar11->start_mark).column;
          sVar4 = (pyVar11->start_mark).index;
          sVar5 = (pyVar11->start_mark).line;
          pyVar12 = (yaml_char_t *)yaml_malloc(1);
          if (pyVar12 == (yaml_char_t *)0x0) {
            iVar15 = 0;
          }
          else {
            *pyVar12 = '\0';
            *(undefined8 *)event = 0;
            (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
            (event->data).scalar.length = 0;
            *(undefined8 *)((long)&event->data + 0x20) = 0;
            (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
            (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
            *(undefined8 *)((long)&event->data + 0x28) = 0;
            parser = (yaml_parser_t *)&(event->data).scalar.style;
            event->type = YAML_SCALAR_EVENT;
            (event->start_mark).index = sVar4;
            (event->start_mark).line = sVar5;
            (event->start_mark).column = sVar3;
            (event->end_mark).index = sVar4;
            (event->end_mark).line = sVar5;
            (event->end_mark).column = sVar3;
            (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
            (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
            (event->data).scalar.value = pyVar12;
            (event->data).scalar.plain_implicit = 1;
            iVar15 = 1;
          }
LAB_001adda0:
          parser->error = YAML_PLAIN_SCALAR_STYLE;
          return iVar15;
        }
        pyVar13 = (parser->states).top;
        if (pyVar13 == (parser->states).end) {
          ppyVar2 = &(parser->states).top;
          iVar9 = yaml_stack_extend(&(parser->states).start,ppyVar2,&(parser->states).end);
          if (iVar9 == 0) goto LAB_001adda0;
          pyVar13 = *ppyVar2;
        }
        (parser->states).top = pyVar13 + 1;
        *pyVar13 = YAML_PARSE_FLOW_MAPPING_VALUE_STATE;
      }
      else {
        pyVar13 = (parser->states).top;
        if (pyVar13 == (parser->states).end) {
          ppyVar2 = &(parser->states).top;
          iVar9 = yaml_stack_extend(&(parser->states).start,ppyVar2,&(parser->states).end);
          if (iVar9 == 0) {
LAB_001add0f:
            parser->error = YAML_MEMORY_ERROR;
            return 0;
          }
          pyVar13 = *ppyVar2;
        }
        (parser->states).top = pyVar13 + 1;
        *pyVar13 = YAML_PARSE_FLOW_MAPPING_EMPTY_VALUE_STATE;
      }
      iVar9 = yaml_parser_parse_node(parser,event,0,0);
      return iVar9;
    }
  }
  pyVar13 = (parser->states).top;
  (parser->states).top = pyVar13 + -1;
  parser->state = pyVar13[-1];
  ppyVar1 = &(parser->marks).top;
  *ppyVar1 = *ppyVar1 + -1;
  *(undefined8 *)event = 0;
  (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
  (event->end_mark).index = 0;
  (event->end_mark).line = 0;
  (event->start_mark).line = 0;
  (event->start_mark).column = 0;
  *(undefined8 *)((long)&event->data + 0x28) = 0;
  (event->start_mark).index = 0;
  (event->data).scalar.length = 0;
  *(undefined8 *)((long)&event->data + 0x20) = 0;
  (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
  (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
  (event->end_mark).column = 0;
  event->type = YAML_MAPPING_END_EVENT;
  (event->start_mark).column = (pyVar11->start_mark).column;
  sVar3 = (pyVar11->start_mark).line;
  (event->start_mark).index = (pyVar11->start_mark).index;
  (event->start_mark).line = sVar3;
  (event->end_mark).column = (pyVar11->end_mark).column;
  sVar3 = (pyVar11->end_mark).line;
  (event->end_mark).index = (pyVar11->end_mark).index;
  (event->end_mark).line = sVar3;
  parser->token_available = 0;
  parser->tokens_parsed = parser->tokens_parsed + 1;
  pyVar11 = (parser->tokens).head;
  parser->stream_end_produced = (uint)(pyVar11->type == YAML_STREAM_END_TOKEN);
  (parser->tokens).head = pyVar11 + 1;
  return 1;
}

Assistant:

static int
yaml_parser_parse_flow_mapping_key(yaml_parser_t *parser,
        yaml_event_t *event, int first)
{
    yaml_token_t *token;

    if (first) {
        token = PEEK_TOKEN(parser);
        if (!PUSH(parser, parser->marks, token->start_mark))
            return 0;
        SKIP_TOKEN(parser);
    }

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (token->type != YAML_FLOW_MAPPING_END_TOKEN)
    {
        if (!first) {
            if (token->type == YAML_FLOW_ENTRY_TOKEN) {
                SKIP_TOKEN(parser);
                token = PEEK_TOKEN(parser);
                if (!token) return 0;
            }
            else {
                return yaml_parser_set_parser_error_context(parser,
                        "while parsing a flow mapping", POP(parser, parser->marks),
                        "did not find expected ',' or '}'", token->start_mark);
            }
        }

        if (token->type == YAML_KEY_TOKEN) {
            SKIP_TOKEN(parser);
            token = PEEK_TOKEN(parser);
            if (!token) return 0;
            if (token->type != YAML_VALUE_TOKEN
                    && token->type != YAML_FLOW_ENTRY_TOKEN
                    && token->type != YAML_FLOW_MAPPING_END_TOKEN) {
                if (!PUSH(parser, parser->states,
                            YAML_PARSE_FLOW_MAPPING_VALUE_STATE))
                    return 0;
                return yaml_parser_parse_node(parser, event, 0, 0);
            }
            else {
                parser->state = YAML_PARSE_FLOW_MAPPING_VALUE_STATE;
                return yaml_parser_process_empty_scalar(parser, event,
                        token->start_mark);
            }
        }
        else if (token->type != YAML_FLOW_MAPPING_END_TOKEN) {
            if (!PUSH(parser, parser->states,
                        YAML_PARSE_FLOW_MAPPING_EMPTY_VALUE_STATE))
                return 0;
            return yaml_parser_parse_node(parser, event, 0, 0);
        }
    }

    parser->state = POP(parser, parser->states);
    (void)POP(parser, parser->marks);
    MAPPING_END_EVENT_INIT(*event, token->start_mark, token->end_mark);
    SKIP_TOKEN(parser);
    return 1;
}